

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  long lVar1;
  BYTE *iend;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  ZSTD_strategy ZVar5;
  ZSTD_compressedBlockState_t *pZVar6;
  unsigned_long_long uVar7;
  uint lastBlock;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  seqDef *psVar11;
  U32 UVar12;
  int iVar13;
  size_t err_code_5;
  size_t sVar14;
  ulong uVar15;
  seqDef *psVar16;
  byte bVar17;
  ushort uVar18;
  long lVar19;
  size_t sVar20;
  uint uVar21;
  ulong dstCapacity_00;
  short *dst_00;
  seqStore_t *psVar22;
  seqStore_t *psVar23;
  size_t srcSize_00;
  ulong uVar24;
  size_t err_code_1;
  ulong uVar25;
  size_t err_code;
  byte bVar26;
  undefined1 auVar27 [16];
  BYTE *local_480;
  repcodes_t dRep;
  BYTE *local_438;
  long local_430;
  repcodes_t local_420;
  size_t local_410;
  short *local_408;
  ZSTD_CCtx_params *local_400;
  ZSTD_cwksp *local_3f8;
  ulong local_3f0;
  seqStore_t nextSeqStore;
  seqStore_t currSeqStore;
  U32 partitions [196];
  
  bVar26 = 0;
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    sVar14 = ZSTD_writeFrameHeader
                       (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                        cctx->dictID);
    if (0xffffffffffffff88 < sVar14) {
      return sVar14;
    }
    dstCapacity = dstCapacity - sVar14;
    dst = (void *)((long)dst + sVar14);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    sVar14 = 0;
  }
  if (srcSize == 0) {
    return sVar14;
  }
  ms = &(cctx->blockState).matchState;
  UVar12 = ZSTD_window_update(&ms->window,src,srcSize,
                              (cctx->blockState).matchState.forceNonContiguous);
  if (UVar12 == 0) {
    (cctx->blockState).matchState.forceNonContiguous = 0;
    (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
  }
  if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
    ZSTD_window_update(&(cctx->ldmState).window,src,srcSize,0);
  }
  local_400 = &cctx->appliedParams;
  if (frame == 0) {
    ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,local_400,src,(void *)((long)src + srcSize));
    uVar15 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
  }
  else {
    uVar10 = (cctx->appliedParams).cParams.windowLog;
    srcSize_00 = cctx->blockSize;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_3f8 = &cctx->workspace;
    origSeqStore = &cctx->seqStore;
    local_480 = (BYTE *)src;
    local_410 = sVar14;
    local_408 = (short *)dst;
    for (sVar20 = srcSize; sVar20 != 0; sVar20 = sVar20 - srcSize_00) {
      lastBlock = lastFrameChunk & 1;
      if (srcSize_00 < sVar20) {
        lastBlock = 0;
      }
      if (dstCapacity < 6) {
        return 0xffffffffffffffba;
      }
      if (sVar20 < srcSize_00) {
        srcSize_00 = sVar20;
      }
      iend = local_480 + srcSize_00;
      ZSTD_overflowCorrectIfNeeded(ms,local_3f8,local_400,local_480,iend);
      if ((cctx->blockState).matchState.loadedDictEnd + (1 << ((byte)uVar10 & 0x1f)) <
          (uint)((int)iend - *(int *)&(cctx->blockState).matchState.window.base)) {
        (cctx->blockState).matchState.loadedDictEnd = 0;
        (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
      }
      uVar21 = (cctx->blockState).matchState.window.lowLimit;
      if ((cctx->blockState).matchState.nextToUpdate < uVar21) {
        (cctx->blockState).matchState.nextToUpdate = uVar21;
      }
      uVar8 = (ushort)lastBlock;
      sVar9 = (short)srcSize_00;
      if ((cctx->appliedParams).targetCBlockSize == 0) {
        if ((cctx->appliedParams).splitBlocks == 0) {
          sVar14 = ZSTD_compressBlock_internal
                             (cctx,(void *)((long)dst + 3),dstCapacity - 3,local_480,srcSize_00,1);
          if (0xffffffffffffff88 < sVar14) {
            return sVar14;
          }
          uVar18 = 2;
          uVar15 = srcSize_00;
          if (sVar14 != 1) {
            if (sVar14 == 0) {
              uVar15 = srcSize_00 + 3;
              if (dstCapacity < uVar15) {
                return 0xffffffffffffffba;
              }
              *(ushort *)dst = uVar8 + sVar9 * 8;
              *(char *)((long)dst + 2) = (char)(srcSize_00 >> 0xd);
              memcpy((void *)((long)dst + 3),local_480,srcSize_00);
              if (0xffffffffffffff88 < uVar15) {
                return uVar15;
              }
              goto LAB_00573210;
            }
            uVar18 = 4;
            uVar15 = sVar14;
          }
          *(ushort *)dst = (uVar18 | uVar8) + (short)uVar15 * 8;
          *(char *)((long)dst + 2) = (char)(uVar15 >> 0xd);
          uVar15 = sVar14 + 3;
        }
        else {
          sVar14 = ZSTD_buildSeqStore(cctx,local_480,srcSize_00);
          if (0xffffffffffffff88 < sVar14) {
            return sVar14;
          }
          if (sVar14 == 1) {
            pZVar6 = (cctx->blockState).prevCBlock;
            if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            if (dstCapacity < srcSize_00 + 3) {
              return 0xffffffffffffffba;
            }
            *(ushort *)dst = uVar8 + sVar9 * 8;
            *(char *)((long)dst + 2) = (char)(srcSize_00 >> 0xd);
            memcpy((void *)((long)dst + 3),local_480,srcSize_00);
            uVar15 = srcSize_00 + 3;
          }
          else {
            uVar15 = (ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3;
            nextSeqStore.sequencesStart = (seqDef *)partitions;
            nextSeqStore.sequences = (seqDef *)0x0;
            uVar21 = (uint)uVar15;
            if (4 < uVar21) {
              ZSTD_deriveBlockSplitsHelper
                        ((seqStoreSplits *)&nextSeqStore,0,uVar15 & 0xffffffff,cctx,origSeqStore);
              (&(nextSeqStore.sequencesStart)->offset)[(long)nextSeqStore.sequences] = uVar21;
            }
            psVar11 = nextSeqStore.sequences;
            pZVar6 = (cctx->blockState).prevCBlock;
            dRep.rep[2] = pZVar6->rep[2];
            dRep.rep._0_8_ = *(undefined8 *)pZVar6->rep;
            local_420.rep._0_8_ = *(undefined8 *)pZVar6->rep;
            local_420.rep[2] = pZVar6->rep[2];
            if (nextSeqStore.sequences == (seqDef *)0x0) {
              uVar15 = ZSTD_compressSeqStore_singleBlock
                                 (cctx,origSeqStore,&dRep,&local_420,dst,dstCapacity,local_480,
                                  srcSize_00,lastBlock,0);
            }
            else {
              local_438 = local_480;
              ZSTD_deriveSeqStoreChunk(&currSeqStore,origSeqStore,0,(ulong)partitions[0]);
              local_430 = 0;
              uVar25 = 0;
              dstCapacity_00 = dstCapacity;
              dst_00 = (short *)dst;
              local_3f0 = (ulong)lastBlock;
              for (psVar16 = (seqDef *)0x0; uVar15 = local_3f0, psVar16 <= psVar11;
                  psVar16 = (seqDef *)((long)&psVar16->offset + 1)) {
                sVar14 = ZSTD_countSeqStoreLiteralsBytes(&currSeqStore);
                lVar19 = 0;
                for (uVar24 = 0;
                    (long)currSeqStore.sequences - (long)currSeqStore.sequencesStart >> 3 != uVar24;
                    uVar24 = uVar24 + 1) {
                  lVar1 = lVar19 + 3 + (ulong)currSeqStore.sequencesStart[uVar24].matchLength;
                  lVar19 = lVar19 + 0x10003 + (ulong)currSeqStore.sequencesStart[uVar24].matchLength
                  ;
                  if (currSeqStore.longLengthType != ZSTD_llt_matchLength) {
                    lVar19 = lVar1;
                  }
                  if (currSeqStore.longLengthPos != uVar24) {
                    lVar19 = lVar1;
                  }
                }
                sVar14 = lVar19 + sVar14;
                local_430 = local_430 + sVar14;
                if (psVar16 == psVar11) {
                  sVar14 = (sVar14 + srcSize_00) - local_430;
                  UVar12 = (U32)uVar15;
                }
                else {
                  ZSTD_deriveSeqStoreChunk
                            (&nextSeqStore,origSeqStore,(ulong)partitions[(long)psVar16],
                             (ulong)partitions[(long)((long)&psVar16->offset + 1)]);
                  UVar12 = 0;
                }
                uVar15 = ZSTD_compressSeqStore_singleBlock
                                   (cctx,&currSeqStore,&dRep,&local_420,dst_00,dstCapacity_00,
                                    local_438,sVar14,UVar12,1);
                if (0xffffffffffffff88 < uVar15) goto LAB_00573200;
                local_438 = local_438 + sVar14;
                dst_00 = (short *)((long)dst_00 + uVar15);
                dstCapacity_00 = dstCapacity_00 - uVar15;
                uVar25 = uVar25 + uVar15;
                psVar22 = &nextSeqStore;
                psVar23 = &currSeqStore;
                for (lVar19 = 10; lVar19 != 0; lVar19 = lVar19 + -1) {
                  psVar23->sequencesStart = psVar22->sequencesStart;
                  psVar22 = (seqStore_t *)((long)psVar22 + (ulong)bVar26 * -0x10 + 8);
                  psVar23 = (seqStore_t *)((long)psVar23 + (ulong)bVar26 * -0x10 + 8);
                }
              }
              pZVar6 = (cctx->blockState).prevCBlock;
              pZVar6->rep[2] = dRep.rep[2];
              *(undefined8 *)pZVar6->rep = dRep.rep._0_8_;
              uVar15 = uVar25;
            }
          }
LAB_00573200:
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
        }
      }
      else {
        sVar14 = ZSTD_buildSeqStore(cctx,local_480,srcSize_00);
        if (0xffffffffffffff88 < sVar14) {
          return sVar14;
        }
        if (sVar14 == 0) {
          if (((cctx->isFirstBlock != 0) || (iVar13 = ZSTD_maybeRLE(origSeqStore), iVar13 == 0)) ||
             (iVar13 = ZSTD_isRLE(local_480,srcSize_00), iVar13 == 0)) {
            uVar15 = ZSTD_compressSuperBlock(cctx,dst,dstCapacity,local_480,srcSize_00,lastBlock);
            if (uVar15 != 0xffffffffffffffba) {
              if (0xffffffffffffff88 < uVar15) {
                return uVar15;
              }
              ZVar5 = (cctx->appliedParams).cParams.strategy;
              bVar17 = (char)ZVar5 - 1;
              if (ZVar5 < ZSTD_btultra) {
                bVar17 = 6;
              }
              if ((uVar15 != 0) && (uVar15 < (srcSize_00 - (srcSize_00 >> (bVar17 & 0x3f))) + 1)) {
                uVar2 = (cctx->blockState).prevCBlock;
                uVar3 = (cctx->blockState).nextCBlock;
                auVar27._8_4_ = (int)uVar2;
                auVar27._0_8_ = uVar3;
                auVar27._12_4_ = (int)((ulong)uVar2 >> 0x20);
                (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar27._8_8_;
                goto LAB_00572d08;
              }
            }
            goto LAB_00572cbf;
          }
          BVar4 = *local_480;
          *(ushort *)dst = uVar8 + 2 + sVar9 * 8;
          *(char *)((long)dst + 2) = (char)(srcSize_00 >> 0xd);
          *(BYTE *)((long)dst + 3) = BVar4;
          uVar15 = 4;
        }
        else {
LAB_00572cbf:
          uVar15 = srcSize_00 + 3;
          if (dstCapacity < uVar15) {
            return 0xffffffffffffffba;
          }
          *(ushort *)dst = uVar8 + sVar9 * 8;
          *(char *)((long)dst + 2) = (char)(srcSize_00 >> 0xd);
          memcpy((void *)((long)dst + 3),local_480,srcSize_00);
          if (0xffffffffffffff88 < uVar15) {
            return uVar15;
          }
        }
LAB_00572d08:
        pZVar6 = (cctx->blockState).prevCBlock;
        if ((pZVar6->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar6->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
      }
LAB_00573210:
      dst = (void *)((long)dst + uVar15);
      dstCapacity = dstCapacity - uVar15;
      cctx->isFirstBlock = 0;
      local_480 = iend;
    }
    if ((lastFrameChunk != 0) && (local_408 < dst)) {
      cctx->stage = ZSTDcs_ending;
    }
    uVar15 = (long)dst - (long)local_408;
    sVar14 = local_410;
  }
  if (uVar15 < 0xffffffffffffff89) {
    uVar7 = cctx->consumedSrcSize;
    cctx->consumedSrcSize = uVar7 + srcSize;
    uVar15 = uVar15 + sVar14;
    cctx->producedCSize = cctx->producedCSize + uVar15;
    sVar14 = 0xffffffffffffffb8;
    if (uVar7 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
      sVar14 = uVar15;
    }
    if (cctx->pledgedSrcSizePlusOne != 0) {
      uVar15 = sVar14;
    }
  }
  return uVar15;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}